

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BindCommand.cpp
# Opt level: O0

void __thiscall BindCommand::doCommand(BindCommand *this)

{
  reference pvVar1;
  unsigned_long uVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  string_conflict local_88;
  size_type local_68;
  unsigned_long indexOfVarName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  string_conflict local_38;
  size_type local_18;
  unsigned_long index;
  BindCommand *this_local;
  
  index = (unsigned_long)this;
  local_18 = DataCommands::getIndex(this->dataCommands);
  local_18 = local_18 + 1;
  DataCommands::getSeparated_abi_cxx11_(&local_50,this->dataCommands);
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at(&local_50,local_18);
  std::__cxx11::string::string((string *)&local_38,(string *)pvVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_50);
  local_18 = local_18 + 1;
  uVar2 = DataCommands::getIndex(this->dataCommands);
  local_68 = uVar2 - 2;
  DataCommands::getSeparated_abi_cxx11_(&local_a0,this->dataCommands);
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at(&local_a0,local_68);
  std::__cxx11::string::string((string *)&local_88,(string *)pvVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a0);
  DataBinds::addNewBind(this->dataBinds,&local_38,&local_88);
  DataCommands::setIndex(this->dataCommands,local_18);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void BindCommand::doCommand() {
    // get the index from dataCommands
    unsigned long index = this->dataCommands->getIndex();
    // skip the command
    index++;
    // get the nameInSimulator from the vector in dataCommands
    string nameInSimulator = this->dataCommands->getSeparated().at(index);
    // skip the nameInSimulator
    index++;
    unsigned long indexOfVarName = this->dataCommands->getIndex() - 2;
    // get the varName from the vector in dataCommands
    string varName = this->dataCommands->getSeparated().at(indexOfVarName);
    // add to the varToNameInSimulator map
    this->dataBinds->addNewBind(nameInSimulator, varName);
    // set the new index of dataCommands
    this->dataCommands->setIndex(index);
}